

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine_unix.cpp
# Opt level: O1

QString * __thiscall
QFSFileEngine::fileName(QString *__return_storage_ptr__,QFSFileEngine *this,FileName file)

{
  QAbstractFileEnginePrivate *pQVar1;
  uint *data;
  long in_FS_OFFSET;
  QFileSystemEntry entry;
  undefined1 local_68 [64];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QAbstractFileEngine).d_ptr.d;
  data = &switchD_0012ce86::switchdataD_00174380;
  switch(file) {
  case BaseName:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      QFileSystemEntry::fileName(__return_storage_ptr__,(QFileSystemEntry *)(pQVar1 + 1));
      return __return_storage_ptr__;
    }
    break;
  case PathName:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      QFileSystemEntry::path(__return_storage_ptr__,(QFileSystemEntry *)(pQVar1 + 1));
      return __return_storage_ptr__;
    }
    break;
  case AbsoluteName:
  case AbsolutePathName:
    local_68._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QFileSystemEngine::absoluteName((QFileSystemEntry *)local_68,(QFileSystemEntry *)(pQVar1 + 1));
    if (file == AbsolutePathName) goto LAB_0012cec4;
LAB_0012cf0a:
    QFileSystemEntry::filePath(__return_storage_ptr__,(QFileSystemEntry *)local_68);
    goto LAB_0012cf14;
  case AbsoluteLinkTarget:
    if (((ulong)pQVar1[2].errorString.d.d & 0x10000) == 0) {
      QFileSystemEngine::fillMetaData
                ((QFileSystemEntry *)(pQVar1 + 1),(QFileSystemMetaData *)&pQVar1[2].errorString,
                 (MetaDataFlags)0x10000);
    }
    if (((ulong)pQVar1[2].errorString.d.d & 0x1000000000000) != 0) {
      local_68._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_68._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_68._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_68._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_68._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QFileSystemEngine::getLinkTarget
                ((QFileSystemEntry *)local_68,(QFileSystemEngine *)(pQVar1 + 1),
                 (QFileSystemEntry *)&pQVar1[2].errorString,(QFileSystemMetaData *)data);
LAB_0012d0d2:
      QFileSystemEntry::filePath(__return_storage_ptr__,(QFileSystemEntry *)local_68);
      goto LAB_0012cf14;
    }
  case BundleName:
  case JunctionName:
switchD_0012ce86_caseD_8:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
      return __return_storage_ptr__;
    }
    break;
  case CanonicalName:
  case CanonicalPathName:
    local_68._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QFileSystemEngine::canonicalName
              ((QFileSystemEntry *)local_68,(QFileSystemEntry *)(pQVar1 + 1),
               (QFileSystemMetaData *)&pQVar1[2].errorString);
    if (file != CanonicalPathName) goto LAB_0012cf0a;
LAB_0012cec4:
    QFileSystemEntry::path(__return_storage_ptr__,(QFileSystemEntry *)local_68);
LAB_0012cf14:
    if ((QArrayData *)local_68._24_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_68._24_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_68._24_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_68._24_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_68._24_8_,1,0x10);
      }
    }
    if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return __return_storage_ptr__;
    }
    break;
  case RawLinkPath:
    if (((ulong)pQVar1[2].errorString.d.d & 0x10000) == 0) {
      QFileSystemEngine::fillMetaData
                ((QFileSystemEntry *)(pQVar1 + 1),(QFileSystemMetaData *)&pQVar1[2].errorString,
                 (MetaDataFlags)0x10000);
    }
    if (((ulong)pQVar1[2].errorString.d.d & 0x1000000000000) != 0) {
      local_68._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_68._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_68._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_68._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_68._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QFileSystemEngine::getRawLinkPath
                ((QFileSystemEntry *)local_68,(QFileSystemEngine *)(pQVar1 + 1),
                 (QFileSystemEntry *)&pQVar1[2].errorString,(QFileSystemMetaData *)data);
      goto LAB_0012d0d2;
    }
    goto switchD_0012ce86_caseD_8;
  default:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      QFileSystemEntry::filePath(__return_storage_ptr__,(QFileSystemEntry *)(pQVar1 + 1));
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

QString QFSFileEngine::fileName(FileName file) const
{
    Q_D(const QFSFileEngine);
    switch (file) {
    case BundleName:
        return QFileSystemEngine::bundleName(d->fileEntry);
    case BaseName:
        return d->fileEntry.fileName();
    case PathName:
        return d->fileEntry.path();
    case AbsoluteName:
    case AbsolutePathName: {
        QFileSystemEntry entry(QFileSystemEngine::absoluteName(d->fileEntry));
        return file == AbsolutePathName ? entry.path() : entry.filePath();
    }
    case CanonicalName:
    case CanonicalPathName: {
        QFileSystemEntry entry(QFileSystemEngine::canonicalName(d->fileEntry, d->metaData));
        return file == CanonicalPathName ? entry.path() : entry.filePath();
    }
    case AbsoluteLinkTarget:
        if (d->isSymlink()) {
            QFileSystemEntry entry = QFileSystemEngine::getLinkTarget(d->fileEntry, d->metaData);
            return entry.filePath();
        }
        return QString();
    case RawLinkPath:
        if (d->isSymlink()) {
            QFileSystemEntry entry = QFileSystemEngine::getRawLinkPath(d->fileEntry, d->metaData);
            return entry.filePath();
        }
        return QString();
    case JunctionName:
        return QString();
    case DefaultName:
    case NFileNames:
        break;
    }
    return d->fileEntry.filePath();
}